

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

Parser * __thiscall Catch::Clara::Parser::operator|=(Parser *this,Parser *other)

{
  const_iterator __first;
  const_iterator __last;
  __normal_iterator<Catch::Clara::Arg_*,_std::vector<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>_>
  local_50;
  const_iterator local_48;
  Opt *local_40;
  Opt *local_38;
  __normal_iterator<const_Catch::Clara::Opt_*,_std::vector<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>_>
  local_30;
  __normal_iterator<Catch::Clara::Opt_*,_std::vector<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>_>
  local_28;
  const_iterator local_20;
  Parser *local_18;
  Parser *other_local;
  Parser *this_local;
  
  local_18 = other;
  other_local = this;
  local_28._M_current =
       (Opt *)std::vector<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>::end
                        (&this->m_options);
  __gnu_cxx::
  __normal_iterator<Catch::Clara::Opt_const*,std::vector<Catch::Clara::Opt,std::allocator<Catch::Clara::Opt>>>
  ::__normal_iterator<Catch::Clara::Opt*>
            ((__normal_iterator<Catch::Clara::Opt_const*,std::vector<Catch::Clara::Opt,std::allocator<Catch::Clara::Opt>>>
              *)&local_20,&local_28);
  local_30._M_current =
       (Opt *)std::vector<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>::begin
                        (&local_18->m_options);
  local_38 = (Opt *)std::vector<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>::end
                              (&local_18->m_options);
  local_40 = (Opt *)std::vector<Catch::Clara::Opt,std::allocator<Catch::Clara::Opt>>::
                    insert<__gnu_cxx::__normal_iterator<Catch::Clara::Opt_const*,std::vector<Catch::Clara::Opt,std::allocator<Catch::Clara::Opt>>>,void>
                              ((vector<Catch::Clara::Opt,std::allocator<Catch::Clara::Opt>> *)
                               &this->m_options,local_20,local_30,
                               (__normal_iterator<const_Catch::Clara::Opt_*,_std::vector<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>_>
                                )local_38);
  local_50._M_current =
       (Arg *)std::vector<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>::end(&this->m_args)
  ;
  __gnu_cxx::
  __normal_iterator<Catch::Clara::Arg_const*,std::vector<Catch::Clara::Arg,std::allocator<Catch::Clara::Arg>>>
  ::__normal_iterator<Catch::Clara::Arg*>
            ((__normal_iterator<Catch::Clara::Arg_const*,std::vector<Catch::Clara::Arg,std::allocator<Catch::Clara::Arg>>>
              *)&local_48,&local_50);
  __first = std::vector<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>::begin
                      (&local_18->m_args);
  __last = std::vector<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>::end
                     (&local_18->m_args);
  std::vector<Catch::Clara::Arg,std::allocator<Catch::Clara::Arg>>::
  insert<__gnu_cxx::__normal_iterator<Catch::Clara::Arg_const*,std::vector<Catch::Clara::Arg,std::allocator<Catch::Clara::Arg>>>,void>
            ((vector<Catch::Clara::Arg,std::allocator<Catch::Clara::Arg>> *)&this->m_args,local_48,
             (__normal_iterator<const_Catch::Clara::Arg_*,_std::vector<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>_>
              )__first._M_current,
             (__normal_iterator<const_Catch::Clara::Arg_*,_std::vector<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>_>
              )__last._M_current);
  return this;
}

Assistant:

Parser& Parser::operator|=( Parser const& other ) {
            m_options.insert( m_options.end(),
                              other.m_options.begin(),
                              other.m_options.end() );
            m_args.insert(
                m_args.end(), other.m_args.begin(), other.m_args.end() );
            return *this;
        }